

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_backend.h
# Opt level: O1

void __thiscall basisu::basisu_backend_output::clear(basisu_backend_output *this)

{
  uchar *puVar1;
  basisu_backend_slice_desc *__ptr;
  vector<unsigned_char> *pvVar2;
  void *__ptr_00;
  unsigned_short *__ptr_01;
  ulong uVar3;
  long lVar4;
  
  this->m_tex_format = cETC1S;
  this->m_etc1s = false;
  this->m_uses_global_codebooks = false;
  this->m_srgb = true;
  this->m_num_endpoints = 0;
  this->m_num_selectors = 0;
  puVar1 = (this->m_endpoint_palette).m_p;
  if (puVar1 != (uchar *)0x0) {
    free(puVar1);
    (this->m_endpoint_palette).m_p = (uchar *)0x0;
    (this->m_endpoint_palette).m_size = 0;
    (this->m_endpoint_palette).m_capacity = 0;
  }
  puVar1 = (this->m_selector_palette).m_p;
  if (puVar1 != (uchar *)0x0) {
    free(puVar1);
    (this->m_selector_palette).m_p = (uchar *)0x0;
    (this->m_selector_palette).m_size = 0;
    (this->m_selector_palette).m_capacity = 0;
  }
  __ptr = (this->m_slice_desc).m_p;
  if (__ptr != (basisu_backend_slice_desc *)0x0) {
    free(__ptr);
    (this->m_slice_desc).m_p = (basisu_backend_slice_desc *)0x0;
    (this->m_slice_desc).m_size = 0;
    (this->m_slice_desc).m_capacity = 0;
  }
  puVar1 = (this->m_slice_image_tables).m_p;
  if (puVar1 != (uchar *)0x0) {
    free(puVar1);
    (this->m_slice_image_tables).m_p = (uchar *)0x0;
    (this->m_slice_image_tables).m_size = 0;
    (this->m_slice_image_tables).m_capacity = 0;
  }
  pvVar2 = (this->m_slice_image_data).m_p;
  if (pvVar2 != (vector<unsigned_char> *)0x0) {
    uVar3 = (ulong)(this->m_slice_image_data).m_size;
    if (uVar3 != 0) {
      lVar4 = 0;
      do {
        __ptr_00 = *(void **)((long)&pvVar2->m_p + lVar4);
        if (__ptr_00 != (void *)0x0) {
          free(__ptr_00);
        }
        lVar4 = lVar4 + 0x10;
      } while (uVar3 << 4 != lVar4);
    }
    free((this->m_slice_image_data).m_p);
    (this->m_slice_image_data).m_p = (vector<unsigned_char> *)0x0;
    (this->m_slice_image_data).m_size = 0;
    (this->m_slice_image_data).m_capacity = 0;
  }
  __ptr_01 = (this->m_slice_image_crcs).m_p;
  if (__ptr_01 != (unsigned_short *)0x0) {
    free(__ptr_01);
    (this->m_slice_image_crcs).m_p = (unsigned_short *)0x0;
    (this->m_slice_image_crcs).m_size = 0;
    (this->m_slice_image_crcs).m_capacity = 0;
  }
  return;
}

Assistant:

void clear()
		{
			m_tex_format = basist::basis_tex_format::cETC1S;
			m_etc1s = false;
			m_uses_global_codebooks = false;
			m_srgb = true;

			m_num_endpoints = 0;
			m_num_selectors = 0;

			m_endpoint_palette.clear();
			m_selector_palette.clear();
			m_slice_desc.clear();
			m_slice_image_tables.clear();
			m_slice_image_data.clear();
			m_slice_image_crcs.clear();
		}